

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::Message::_InternalParse::ReflectiveFieldParser::Field
          (ReflectiveFieldParser *this,int num,int wire_type)

{
  DescriptorPool *this_00;
  uint uVar1;
  FieldDescriptor *pFVar2;
  ExtensionRange *pEVar3;
  bool bVar4;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  pFVar2 = Descriptor::FindFieldByNumber(this->descriptor_,num);
  if (pFVar2 == (FieldDescriptor *)0x0) {
    pEVar3 = Descriptor::FindExtensionRangeContainingNumber(this->descriptor_,num);
    if (pEVar3 != (ExtensionRange *)0x0) {
      this_00 = (this->ctx_->data_).pool;
      if (this_00 == (DescriptorPool *)0x0) {
        pFVar2 = Reflection::FindKnownExtensionByNumber(this->reflection_,num);
      }
      else {
        pFVar2 = DescriptorPool::FindExtensionByNumber(this_00,this->descriptor_,num);
      }
      if (pFVar2 != (FieldDescriptor *)0x0) goto LAB_0028f4cc;
    }
    pFVar2 = (FieldDescriptor *)0x0;
  }
  else {
LAB_0028f4cc:
    if (*(once_flag **)(pFVar2 + 0x30) != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = pFVar2;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar2 + 0x30),&local_28,&local_30);
    }
    uVar1 = *(uint *)(pFVar2 + 0x38);
    if (*(int *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)uVar1 * 4) != wire_type) {
      if (*(int *)(pFVar2 + 0x3c) == 3) {
        if (*(once_flag **)(pFVar2 + 0x30) != (once_flag *)0x0) {
          local_28 = FieldDescriptor::TypeOnceInit;
          local_30 = pFVar2;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar2 + 0x30),&local_28,&local_30);
          uVar1 = *(uint *)(pFVar2 + 0x38);
        }
        bVar4 = uVar1 - 0xd < 0xfffffffc;
      }
      else {
        bVar4 = false;
      }
      if (!bVar4) {
        pFVar2 = (FieldDescriptor *)0x0;
      }
      if (wire_type != 2) {
        pFVar2 = (FieldDescriptor *)0x0;
      }
    }
  }
  return pFVar2;
}

Assistant:

const FieldDescriptor* Field(int num, int wire_type) {
      auto field = descriptor_->FindFieldByNumber(num);

      // If that failed, check if the field is an extension.
      if (field == nullptr && descriptor_->IsExtensionNumber(num)) {
        const DescriptorPool* pool = ctx_->data().pool;
        if (pool == NULL) {
          field = reflection_->FindKnownExtensionByNumber(num);
        } else {
          field = pool->FindExtensionByNumber(descriptor_, num);
        }
      }
      if (field == nullptr) return nullptr;

      if (internal::WireFormat::WireTypeForFieldType(field->type()) !=
          wire_type) {
        if (field->is_packable()) {
          if (wire_type ==
              internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
            return field;
          }
        }
        return nullptr;
      }
      return field;
    }